

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O3

void * SBGInterfaceThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  char *__s_00;
  timespec local_40;
  
  if ((szSBGInterfacePath[0] == ':') && (iVar3 = atoi(szSBGInterfacePath + 1), 0 < iVar3)) {
    SBGInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar3 = LaunchMultiCliTCPSrv(szSBGInterfacePath + 1,handlesbginterfacecli,(void *)0x0);
      if (iVar3 == 0) goto LAB_00195181;
      puts("Error launching the SBGInterface server.");
      local_40.tv_sec = 4;
      local_40.tv_nsec = 0;
      nanosleep(&local_40,(timespec *)0x0);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    __s = "SBGInterface disconnection failed.";
    do {
      if (bVar1) {
        iVar3 = handlesbginterface(&SBGInterfacePseudoRS232Port);
        if (iVar3 == 0) {
          bVar1 = true;
          bVar2 = false;
        }
        else {
          puts("Connection to a SBGInterface lost.");
          iVar3 = CloseRS232Port(&SBGInterfacePseudoRS232Port);
          __s_00 = "SBGInterface disconnection failed.";
          if (iVar3 == 0) {
            __s_00 = "SBGInterface disconnected.";
          }
          puts(__s_00);
          local_40.tv_sec = 0;
          local_40.tv_nsec = 20000000;
LAB_00195112:
          bVar1 = false;
          nanosleep(&local_40,(timespec *)0x0);
          bVar2 = true;
        }
      }
      else {
        iVar3 = connectsbginterface(&SBGInterfacePseudoRS232Port);
        if (iVar3 != 0) {
          local_40.tv_sec = 1;
          local_40.tv_nsec = 0;
          goto LAB_00195112;
        }
        local_40.tv_sec = 0;
        local_40.tv_nsec = 20000000;
        bVar2 = false;
        nanosleep(&local_40,(timespec *)0x0);
        bVar1 = true;
      }
    } while (bExit == 0);
    if (!bVar2) {
      iVar3 = CloseRS232Port(&SBGInterfacePseudoRS232Port);
      if (iVar3 == 0) {
        __s = "SBGInterface disconnected.";
      }
      puts(__s);
LAB_00195181:
      if (bExit == 0) {
        bExit = 1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(sbginterfacefilename, LOG_FOLDER"sbginterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//sbginterfacefile = fopen(sbginterfacefilename, "w");
	//if (sbginterfacefile == NULL)
	//{
	//	printf("Unable to create sbginterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szSBGInterfacePath[0] == ':')&&(atoi(szSBGInterfacePath+1) > 0))
	{
		SBGInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szSBGInterfacePath+1, handlesbginterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the SBGInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*20);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("SBGInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectsbginterface(&SBGInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*20);
					bConnected = TRUE; 

					inithandlesbginterface(&SBGInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlesbginterface(&SBGInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a SBGInterface lost.\n");
					bConnected = FALSE;
					disconnectsbginterface(&SBGInterfacePseudoRS232Port);
					uSleep(1000*20);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectsbginterface(&SBGInterfacePseudoRS232Port);
	}

	//fclose(sbginterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}